

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

null_terminating_iterator<char> __thiscall
fmt::v5::internal::
parse_format_specs<fmt::v5::internal::null_terminating_iterator<char>,fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>>&>
          (internal *this,null_terminating_iterator<char> it,
          specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>
          *handler)

{
  null_terminating_iterator<char> other;
  null_terminating_iterator<char> nVar1;
  char cVar2;
  char cVar3;
  bool bVar4;
  uint uVar5;
  width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>_&,_char>
  *handler_00;
  precision_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>_&,_char>
  *handler_01;
  specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>
  *this_00;
  null_terminating_iterator<char> it_00;
  null_terminating_iterator<char> it_01;
  null_terminating_iterator<char> local_160;
  null_terminating_iterator<char> local_150;
  precision_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>_&,_char>
  local_140;
  null_terminating_iterator<char> local_138;
  null_terminating_iterator<char> local_128;
  null_terminating_iterator<char> local_118;
  null_terminating_iterator<char> local_108;
  width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>_&,_char>
  local_f8;
  null_terminating_iterator<char> local_f0;
  null_terminating_iterator<char> local_e0;
  null_terminating_iterator<char> local_d0;
  null_terminating_iterator<char> local_c0;
  null_terminating_iterator<char> local_b0;
  null_terminating_iterator<char> local_a0;
  null_terminating_iterator<char> local_90;
  null_terminating_iterator<char> local_80;
  null_terminating_iterator<char> local_70;
  specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>
  *local_60;
  char *local_58;
  undefined1 local_50 [8];
  null_terminating_iterator<char> p;
  alignment local_38;
  int i;
  alignment align;
  char_type c;
  specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>
  *handler_local;
  null_terminating_iterator<char> it_local;
  char *local_10;
  
  this_00 = (specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>
             *)it.end_;
  it_local.ptr_ = it.ptr_;
  handler_local =
       (specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>
        *)this;
  cVar2 = null_terminating_iterator<char>::operator*
                    ((null_terminating_iterator<char> *)&handler_local);
  if ((cVar2 == '}') || (cVar2 == '\0')) {
    it_local.end_ = (char *)handler_local;
    local_10 = it_local.ptr_;
    goto LAB_001faced;
  }
  local_38 = ALIGN_DEFAULT;
  p.end_._4_4_ = 1;
  do {
    _local_50 = null_terminating_iterator<char>::operator+
                          ((null_terminating_iterator<char> *)&handler_local,(long)p.end_._4_4_);
    cVar3 = null_terminating_iterator<char>::operator*((null_terminating_iterator<char> *)local_50);
    switch(cVar3) {
    case '<':
      local_38 = ALIGN_LEFT;
      break;
    case '=':
      local_38 = ALIGN_NUMERIC;
      break;
    case '>':
      local_38 = ALIGN_RIGHT;
      break;
    case '^':
      local_38 = ALIGN_CENTER;
    }
    if (local_38 != ALIGN_DEFAULT) {
      local_60 = handler_local;
      local_58 = it_local.ptr_;
      other.end_ = it_local.ptr_;
      other.ptr_ = (char *)handler_local;
      bVar4 = null_terminating_iterator<char>::operator!=
                        ((null_terminating_iterator<char> *)local_50,other);
      if (bVar4) {
        if (cVar2 == '{') {
          specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
          ::on_error((specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                      *)this_00,"invalid fill character \'{\'");
          it_local.end_ = (char *)handler_local;
          local_10 = it_local.ptr_;
          goto LAB_001faced;
        }
        local_70 = null_terminating_iterator<char>::operator+=
                             ((null_terminating_iterator<char> *)&handler_local,2);
        specs_setter<char>::on_fill((specs_setter<char> *)this_00,cVar2);
      }
      else {
        local_80 = null_terminating_iterator<char>::operator++
                             ((null_terminating_iterator<char> *)&handler_local);
      }
      specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>
      ::on_align(this_00,local_38);
      break;
    }
    p.end_._4_4_ = p.end_._4_4_ + -1;
  } while (-1 < p.end_._4_4_);
  cVar2 = null_terminating_iterator<char>::operator*
                    ((null_terminating_iterator<char> *)&handler_local);
  if (cVar2 == ' ') {
    specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>
    ::on_space(this_00);
    local_b0 = null_terminating_iterator<char>::operator++
                         ((null_terminating_iterator<char> *)&handler_local);
  }
  else if (cVar2 == '+') {
    specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>
    ::on_plus(this_00);
    local_90 = null_terminating_iterator<char>::operator++
                         ((null_terminating_iterator<char> *)&handler_local);
  }
  else if (cVar2 == '-') {
    specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>
    ::on_minus(this_00);
    local_a0 = null_terminating_iterator<char>::operator++
                         ((null_terminating_iterator<char> *)&handler_local);
  }
  cVar2 = null_terminating_iterator<char>::operator*
                    ((null_terminating_iterator<char> *)&handler_local);
  if (cVar2 == '#') {
    specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>
    ::on_hash(this_00);
    local_c0 = null_terminating_iterator<char>::operator++
                         ((null_terminating_iterator<char> *)&handler_local);
  }
  cVar2 = null_terminating_iterator<char>::operator*
                    ((null_terminating_iterator<char> *)&handler_local);
  if (cVar2 == '0') {
    specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>
    ::on_zero(this_00);
    local_d0 = null_terminating_iterator<char>::operator++
                         ((null_terminating_iterator<char> *)&handler_local);
  }
  cVar2 = null_terminating_iterator<char>::operator*
                    ((null_terminating_iterator<char> *)&handler_local);
  handler_00 = (width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>_&,_char>
                *)(ulong)(uint)(int)cVar2;
  if ((cVar2 < 0x30) ||
     (cVar2 = null_terminating_iterator<char>::operator*
                        ((null_terminating_iterator<char> *)&handler_local), '9' < cVar2)) {
    cVar2 = null_terminating_iterator<char>::operator*
                      ((null_terminating_iterator<char> *)&handler_local);
    if (cVar2 == '{') {
      local_f0 = null_terminating_iterator<char>::operator+
                           ((null_terminating_iterator<char> *)&handler_local,1);
      width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>_&,_char>
      ::width_adapter(&local_f8,this_00);
      it_00.end_ = (char *)&local_f8;
      it_00.ptr_ = local_f0.end_;
      local_e0 = parse_arg_id<fmt::v5::internal::null_terminating_iterator<char>,fmt::v5::internal::width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>>&,char>>
                           ((internal *)local_f0.ptr_,it_00,handler_00);
      handler_local =
           (specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>
            *)local_e0.ptr_;
      it_local.ptr_ = local_e0.end_;
      local_108 = null_terminating_iterator<char>::operator++
                            ((null_terminating_iterator<char> *)&handler_local,0);
      cVar2 = null_terminating_iterator<char>::operator*(&local_108);
      if (cVar2 != '}') {
        specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        ::on_error((specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                    *)this_00,"invalid format string");
        it_local.end_ = (char *)handler_local;
        local_10 = it_local.ptr_;
        goto LAB_001faced;
      }
    }
  }
  else {
    uVar5 = parse_nonnegative_int<fmt::v5::internal::null_terminating_iterator<char>,fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>>&>
                      ((null_terminating_iterator<char> *)&handler_local,this_00);
    specs_setter<char>::on_width((specs_setter<char> *)this_00,uVar5);
  }
  cVar2 = null_terminating_iterator<char>::operator*
                    ((null_terminating_iterator<char> *)&handler_local);
  if (cVar2 == '.') {
    local_118 = null_terminating_iterator<char>::operator++
                          ((null_terminating_iterator<char> *)&handler_local);
    cVar2 = null_terminating_iterator<char>::operator*
                      ((null_terminating_iterator<char> *)&handler_local);
    handler_01 = (precision_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>_&,_char>
                  *)(ulong)(uint)(int)cVar2;
    if ((cVar2 < 0x30) ||
       (cVar2 = null_terminating_iterator<char>::operator*
                          ((null_terminating_iterator<char> *)&handler_local), '9' < cVar2)) {
      cVar2 = null_terminating_iterator<char>::operator*
                        ((null_terminating_iterator<char> *)&handler_local);
      if (cVar2 != '{') {
        specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        ::on_error((specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                    *)this_00,"missing precision specifier");
        it_local.end_ = (char *)handler_local;
        local_10 = it_local.ptr_;
        goto LAB_001faced;
      }
      local_138 = null_terminating_iterator<char>::operator+
                            ((null_terminating_iterator<char> *)&handler_local,1);
      precision_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>_&,_char>
      ::precision_adapter(&local_140,this_00);
      it_01.end_ = (char *)&local_140;
      it_01.ptr_ = local_138.end_;
      local_128 = parse_arg_id<fmt::v5::internal::null_terminating_iterator<char>,fmt::v5::internal::precision_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>>&,char>>
                            ((internal *)local_138.ptr_,it_01,handler_01);
      handler_local =
           (specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>
            *)local_128.ptr_;
      it_local.ptr_ = local_128.end_;
      local_150 = null_terminating_iterator<char>::operator++
                            ((null_terminating_iterator<char> *)&handler_local,0);
      cVar2 = null_terminating_iterator<char>::operator*(&local_150);
      if (cVar2 != '}') {
        specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        ::on_error((specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                    *)this_00,"invalid format string");
        it_local.end_ = (char *)handler_local;
        local_10 = it_local.ptr_;
        goto LAB_001faced;
      }
    }
    else {
      uVar5 = parse_nonnegative_int<fmt::v5::internal::null_terminating_iterator<char>,fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>>&>
                        ((null_terminating_iterator<char> *)&handler_local,this_00);
      specs_setter<char>::on_precision((specs_setter<char> *)this_00,uVar5);
    }
    specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>
    ::end_precision(this_00);
  }
  cVar2 = null_terminating_iterator<char>::operator*
                    ((null_terminating_iterator<char> *)&handler_local);
  if ((cVar2 != '}') &&
     (cVar2 = null_terminating_iterator<char>::operator*
                        ((null_terminating_iterator<char> *)&handler_local), cVar2 != '\0')) {
    local_160 = null_terminating_iterator<char>::operator++
                          ((null_terminating_iterator<char> *)&handler_local,0);
    cVar2 = null_terminating_iterator<char>::operator*(&local_160);
    specs_setter<char>::on_type((specs_setter<char> *)this_00,cVar2);
  }
  it_local.end_ = (char *)handler_local;
  local_10 = it_local.ptr_;
LAB_001faced:
  nVar1.end_ = local_10;
  nVar1.ptr_ = it_local.end_;
  return nVar1;
}

Assistant:

FMT_CONSTEXPR Iterator parse_format_specs(Iterator it, SpecHandler &&handler) {
  typedef typename std::iterator_traits<Iterator>::value_type char_type;
  char_type c = *it;
  if (c == '}' || !c)
    return it;

  // Parse fill and alignment.
  alignment align = ALIGN_DEFAULT;
  int i = 1;
  do {
    auto p = it + i;
    switch (*p) {
      case '<':
        align = ALIGN_LEFT;
        break;
      case '>':
        align = ALIGN_RIGHT;
        break;
      case '=':
        align = ALIGN_NUMERIC;
        break;
      case '^':
        align = ALIGN_CENTER;
        break;
    }
    if (align != ALIGN_DEFAULT) {
      if (p != it) {
        if (c == '{') {
          handler.on_error("invalid fill character '{'");
          return it;
        }
        it += 2;
        handler.on_fill(c);
      } else ++it;
      handler.on_align(align);
      break;
    }
  } while (--i >= 0);

  // Parse sign.
  switch (*it) {
    case '+':
      handler.on_plus();
      ++it;
      break;
    case '-':
      handler.on_minus();
      ++it;
      break;
    case ' ':
      handler.on_space();
      ++it;
      break;
  }

  if (*it == '#') {
    handler.on_hash();
    ++it;
  }

  // Parse zero flag.
  if (*it == '0') {
    handler.on_zero();
    ++it;
  }

  // Parse width.
  if ('0' <= *it && *it <= '9') {
    handler.on_width(parse_nonnegative_int(it, handler));
  } else if (*it == '{') {
    it = parse_arg_id(it + 1, width_adapter<SpecHandler, char_type>(handler));
    if (*it++ != '}') {
      handler.on_error("invalid format string");
      return it;
    }
  }

  // Parse precision.
  if (*it == '.') {
    ++it;
    if ('0' <= *it && *it <= '9') {
      handler.on_precision(parse_nonnegative_int(it, handler));
    } else if (*it == '{') {
      it = parse_arg_id(
            it + 1, precision_adapter<SpecHandler, char_type>(handler));
      if (*it++ != '}') {
        handler.on_error("invalid format string");
        return it;
      }
    } else {
      handler.on_error("missing precision specifier");
      return it;
    }
    handler.end_precision();
  }

  // Parse type.
  if (*it != '}' && *it)
    handler.on_type(*it++);
  return it;
}